

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool ON_IsCurvatureDiscontinuity
               (ON_3dVector Km,ON_3dVector Kp,double cos_angle_tolerance,double curvature_tolerance,
               double zero_curvature,double radius_tolerance,double relative_tolerance)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ON_3dVector local_38;
  
  ON_3dVector::operator-(&local_38,&Km,&Kp);
  dVar3 = ON_3dVector::Length(&local_38);
  bVar1 = ON_IsValid(dVar3);
  if (bVar1) {
    if (dVar3 <= 0.0) {
      return false;
    }
    if (dVar3 <= curvature_tolerance) {
      return false;
    }
    if (zero_curvature <= 7.7037197787136e-34) {
      zero_curvature = 7.7037197787136e-34;
    }
    dVar3 = ON_3dVector::Length(&Km);
    dVar4 = ON_3dVector::Length(&Kp);
    dVar3 = (double)(-(ulong)(zero_curvature < dVar3) & (ulong)dVar3);
    if (dVar4 <= zero_curvature) {
      dVar4 = 0.0;
      if ((dVar3 == 0.0) && (!NAN(dVar3))) {
        return false;
      }
    }
    if ((0.0 < dVar3) && (0.0 < dVar4)) {
      bVar1 = 0.0 < curvature_tolerance;
      bVar2 = bVar1;
      if (ABS(cos_angle_tolerance) <= 1.0) {
        dVar5 = ON_3dVector::operator*(&Kp,&Km);
        dVar6 = dVar3 * dVar4 * cos_angle_tolerance;
        if (dVar5 < dVar6) {
          return true;
        }
        bVar2 = 0.0 < curvature_tolerance && dVar5 < dVar6;
      }
      if (0.0 <= radius_tolerance) {
        if (dVar3 * dVar4 * radius_tolerance < ABS(dVar3 - dVar4)) {
          return true;
        }
        bVar1 = false;
      }
      if (0.0 < relative_tolerance) {
        dVar5 = dVar3;
        if (dVar3 <= dVar4) {
          dVar5 = dVar4;
        }
        if (dVar5 * relative_tolerance < ABS(dVar3 - dVar4)) {
          return true;
        }
        bVar1 = false;
      }
      return (bool)(bVar2 | bVar1);
    }
  }
  return true;
}

Assistant:

bool ON_IsCurvatureDiscontinuity( 
  const ON_3dVector Km, 
  const ON_3dVector Kp,
  double cos_angle_tolerance,
  double curvature_tolerance,
  double zero_curvature,
  double radius_tolerance,
  double relative_tolerance
  )
{
  const double d = (Km-Kp).Length();
  if ( !ON_IsValid(d) )
  {
    // invalid curvatures - call it discontinuous because
    // there is a good chance the derivative evaluation 
    // failed or the first derivative is zero.
    return true;
  }

  // The d <= 0.0 test handles the case when 
  // curvature_tolerance is ON_UNSET_VALUE
  if ( d <= 0.0 || d <= curvature_tolerance )
    return false; // "equal" curvature vectors

  // If the scalar curvature is <= zero_curvature,
  // then K is small enough that we assume it is zero.
  // The primary reason for doing this is to prevent
  // reporting a curvature discontinuity when one
  // or both of the curvatures is small1.0e-300 and 1.0e-200
  if ( !(zero_curvature > 7.7037197787136e-34) )
    zero_curvature = 7.7037197787136e-34;
  double km = Km.Length();
  double kp = Kp.Length();
  // If km or kp are NaNs, I treat them as zero so
  // the rest of this code can assume they are 0.0
  // or positive.
  if ( !(km > zero_curvature) )
    km = 0.0;
  if ( !(kp > zero_curvature) )
  {
    kp = 0.0;
    if ( 0.0 == km )
    {
      // both curvatures are "zero"
      return false;
    }
  }

  if ( !(km > 0.0 && kp > 0.0) )
  {
    // one side is flat and the other is curved.
    return true;
  }

  // Nov 1, 2012 Dale Lear
  // This test was wrong.  Read the description of the curvature_tolerance
  // parameter in the header file.
  //////if ( 0.0 == curvature_tolerance )
  //////{
  //////  // User is asking for exact match.
  //////  return true;
  //////}

  // At this point we know km > 0 and kp > 0.

  bool bPointOfInflection = (curvature_tolerance > 0.0);
  bool bDifferentScalars = bPointOfInflection;
  // NOTE: 
  //   At this point either curvature_tolerance was not
  //   specified or |Km - Kp| > curvature_tolerance. Because
  //   it is difficult to come up with a meaningful value for
  //   curvature_tolerance that works at all scales, the
  //   additional tests below are used to determine if 
  //   Km and Kp are different enough to matter. If additional
  //   tests are performed, then bTestCurvatureTolerance
  //   is set to false. If no additional tests are performed,
  //   then bTestCurvatureTolerance will remain true and
  //   the |Km-Kp| > curvature_tolerance test is performed
  //   at the end of this function.

  if ( cos_angle_tolerance >= -1.0 && cos_angle_tolerance <= 1.0 )
  {
    const double KmoKp = Kp*Km;
    if ( KmoKp < km*kp*cos_angle_tolerance )
      return true; // Km and Kp are not parallel
    bPointOfInflection = false;
  }

  // At this point we assume Km and Kp are parallel and we
  // know km > 0 and kp > 0.
  if ( radius_tolerance >= 0.0 )
  {
    // This test is if (fabs(rm - rp) > radius_tolerance) return true
    // where rm = 1.0/km and rp = 1.0/kp.  It is coded the way
    // it is to avoid divides (not that that really matters any more).
    if ( fabs(km-kp) > kp*km*radius_tolerance )
      // radii do not agree
      return true;
    bDifferentScalars = false;
  }

  if ( relative_tolerance > 0.0 )
  {
    if ( fabs(km-kp) > ((km>kp)?km:kp)*relative_tolerance )
    {
      return true;
    }
    bDifferentScalars = false;
  }

  if ( bPointOfInflection || bDifferentScalars )
  {
    // |Km - Kp| > curvature_tolerance and we were not asked to
    // perform and other tests.
    return true;
  }

  return false; // treat Km and Kp as equal curvatures.
}